

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_resolveWithPresentChildUnits_Test::~Importer_resolveWithPresentChildUnits_Test
          (Importer_resolveWithPresentChildUnits_Test *this)

{
  Importer_resolveWithPresentChildUnits_Test *this_local;
  
  ~Importer_resolveWithPresentChildUnits_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, resolveWithPresentChildUnits)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/importing_units_with_present_children.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    auto importer = libcellml::Importer::create();
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(0), importer->issueCount());
}